

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O0

bool __thiscall Character::AddTradeItem(Character *this,short item,int amount)

{
  World *pWVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  mapped_type *pmVar5;
  size_type sVar6;
  int *piVar7;
  reference pCVar8;
  ulong uVar9;
  value_type local_f8;
  Character_Item newitem;
  Character_Item *character_item;
  iterator __end1;
  iterator __begin1;
  list<Character_Item,_std::allocator<Character_Item>_> *__range1;
  key_type local_c8;
  Character_Item local_a8;
  Character_Item trade_item;
  iterator __end2;
  iterator __begin2;
  list<Character_Item,_std::allocator<Character_Item>_> *__range2;
  int tradeitem;
  int local_60 [2];
  int hasitem;
  allocator<char> local_49;
  key_type local_48;
  byte local_21;
  int local_20;
  short sStack_1a;
  bool trade_add_quantity;
  int amount_local;
  short item_local;
  Character *this_local;
  
  pWVar1 = this->world;
  local_20 = amount;
  sStack_1a = item;
  _amount_local = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"TradeAddQuantity",&local_49);
  pmVar5 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
           ::operator[](&(pWVar1->config).
                         super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                        ,&local_48);
  bVar2 = util::variant::operator_cast_to_bool(pmVar5);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  if ((sStack_1a < 1) ||
     (uVar9 = (ulong)sStack_1a, local_21 = bVar2,
     sVar6 = std::vector<EIF_Data_Base<EIF>,_std::allocator<EIF_Data_Base<EIF>_>_>::size
                       (&this->world->eif->data), sVar6 <= uVar9)) {
    this_local._7_1_ = false;
  }
  else {
    local_60[0] = HasItem(this,sStack_1a,(bool)((local_21 ^ 0xff) & 1));
    piVar7 = std::min<int>(&local_20,local_60);
    iVar4 = *piVar7;
    __range2._6_1_ = 0;
    __range2._5_1_ = 0;
    bVar2 = true;
    local_20 = iVar4;
    if (0 < iVar4) {
      pWVar1 = this->world;
      std::allocator<char>::allocator();
      __range2._6_1_ = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&tradeitem,"MaxTrade",(allocator<char> *)((long)&__range2 + 7));
      __range2._5_1_ = 1;
      pmVar5 = std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
               ::operator[](&(pWVar1->config).
                             super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                            ,(key_type *)&tradeitem);
      iVar3 = util::variant::operator_cast_to_int(pmVar5);
      bVar2 = iVar3 < iVar4;
    }
    if ((__range2._5_1_ & 1) != 0) {
      std::__cxx11::string::~string((string *)&tradeitem);
    }
    if ((__range2._6_1_ & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)((long)&__range2 + 7));
    }
    if (bVar2) {
      this_local._7_1_ = false;
    }
    else {
      if ((local_21 & 1) != 0) {
        __range2._0_4_ = 0;
        __end2 = std::__cxx11::list<Character_Item,_std::allocator<Character_Item>_>::begin
                           (&this->trade_inventory);
        trade_item = (Character_Item)
                     std::__cxx11::list<Character_Item,_std::allocator<Character_Item>_>::end
                               (&this->trade_inventory);
        while (bVar2 = std::operator!=(&__end2,(_Self *)&trade_item), bVar2) {
          pCVar8 = std::_List_iterator<Character_Item>::operator*(&__end2);
          local_a8 = *pCVar8;
          if (local_a8.id == sStack_1a) {
            __range2._0_4_ = local_a8.amount;
          }
          std::_List_iterator<Character_Item>::operator++(&__end2);
        }
        __range1._6_1_ = 0;
        __range1._5_1_ = 0;
        bVar2 = true;
        if (-1 < (int)__range2 + local_20) {
          iVar3 = (int)__range2 + local_20;
          pWVar1 = this->world;
          std::allocator<char>::allocator();
          __range1._6_1_ = 1;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_c8,"MaxTrade",(allocator<char> *)((long)&__range1 + 7));
          __range1._5_1_ = 1;
          pmVar5 = std::
                   unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                   ::operator[](&(pWVar1->config).
                                 super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                                ,&local_c8);
          iVar4 = util::variant::operator_cast_to_int(pmVar5);
          bVar2 = iVar4 < iVar3;
        }
        if ((__range1._5_1_ & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_c8);
        }
        if ((__range1._6_1_ & 1) != 0) {
          std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
        }
        if (bVar2) {
          return false;
        }
      }
      __end1 = std::__cxx11::list<Character_Item,_std::allocator<Character_Item>_>::begin
                         (&this->trade_inventory);
      character_item =
           (Character_Item *)
           std::__cxx11::list<Character_Item,_std::allocator<Character_Item>_>::end
                     (&this->trade_inventory);
      while (bVar2 = std::operator!=(&__end1,(_Self *)&character_item), bVar2) {
        newitem = (Character_Item)std::_List_iterator<Character_Item>::operator*(&__end1);
        if (*(short *)newitem == sStack_1a) {
          if ((local_21 & 1) == 0) {
            *(int *)((long)newitem + 4) = local_20;
          }
          else {
            *(int *)((long)newitem + 4) = local_20 + *(int *)((long)newitem + 4);
          }
          return true;
        }
        std::_List_iterator<Character_Item>::operator++(&__end1);
      }
      local_f8.id = sStack_1a;
      local_f8.amount = local_20;
      std::__cxx11::list<Character_Item,_std::allocator<Character_Item>_>::push_back
                (&this->trade_inventory,&local_f8);
      CheckQuestRules(this);
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Character::AddTradeItem(short item, int amount)
{
	bool trade_add_quantity = bool(this->world->config["TradeAddQuantity"]);

	if (item <= 0 || static_cast<std::size_t>(item) >= this->world->eif->data.size())
	{
		return false;
	}

	int hasitem = this->HasItem(item, !trade_add_quantity);

	amount = std::min(amount, hasitem);

	if (amount <= 0 || amount > int(this->world->config["MaxTrade"]))
	{
		return false;
	}

	// Prevent overflow
	if (trade_add_quantity)
	{
		int tradeitem = 0;

		UTIL_FOREACH(this->trade_inventory, trade_item)
		{
			if (trade_item.id == item)
			{
				tradeitem = trade_item.amount;
			}
		}

		if (tradeitem + amount < 0 || tradeitem + amount > int(this->world->config["MaxTrade"]))
		{
			return false;
		}

	}

	UTIL_FOREACH_REF(this->trade_inventory, character_item)
	{
		if (character_item.id == item)
		{
			if (trade_add_quantity)
				character_item.amount += amount;
			else
				character_item.amount = amount;

			return true;
		}
	}

	Character_Item newitem;
	newitem.id = item;
	newitem.amount = amount;

	this->trade_inventory.push_back(newitem);
	this->CheckQuestRules();

	return true;
}